

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.h
# Opt level: O0

LogParameter * __thiscall caffe::LayerParameter::mutable_log_param(LayerParameter *this)

{
  LogParameter *this_00;
  LayerParameter *this_local;
  
  set_has_log_param(this);
  if (this->log_param_ == (LogParameter *)0x0) {
    this_00 = (LogParameter *)operator_new(0x28);
    LogParameter::LogParameter(this_00);
    this->log_param_ = this_00;
  }
  return this->log_param_;
}

Assistant:

inline ::caffe::LogParameter* LayerParameter::mutable_log_param() {
  set_has_log_param();
  if (log_param_ == NULL) {
    log_param_ = new ::caffe::LogParameter;
  }
  // @@protoc_insertion_point(field_mutable:caffe.LayerParameter.log_param)
  return log_param_;
}